

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void queries::API::TriplePatern
               (vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *constrains,
               vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *projections,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *resultsmaster,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *provmaster)

{
  pointer *this;
  pair<const_unsigned_long,_Molecule> *ppVar1;
  KEY_ID o;
  bool bVar2;
  TYPE_ID TVar3;
  size_type sVar4;
  reference pvVar5;
  reference pppVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  reference prov_00;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>,_bool> pVar10;
  ulong local_148;
  size_t i_1;
  ulong uStack_138;
  TYPE_ID tt;
  size_t i;
  undefined1 local_128 [7];
  bool cont;
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  prov;
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  results;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  tripleTemplates;
  _Node_iterator_base<unsigned_long,_false> local_b8;
  _Self local_b0;
  _Self local_a8;
  iterator it;
  pair<const_unsigned_long,_Molecule> *local_90;
  pair<const_unsigned_long,_Molecule> *m_1;
  undefined1 local_80;
  pair<const_unsigned_long,_Molecule> *local_68;
  pair<const_unsigned_long,_Molecule> *m;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  *Molecules_with_O;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  molecules;
  vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
  *provmaster_local;
  vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
  *resultsmaster_local;
  vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *projections_local;
  vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *constrains_local;
  
  molecules._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)provmaster;
  std::
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  ::set((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
         *)&Molecules_with_O);
  m = (pair<const_unsigned_long,_Molecule> *)0x0;
  sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size(constrains);
  if (sVar4 == 0) {
    pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                       (projections,0);
    local_90 = Molecules::GetPair((Molecules *)diplo::M,pvVar5->subject);
    if (local_90 != (pair<const_unsigned_long,_Molecule> *)0x0) {
      pVar10 = std::
               set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               ::insert((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                         *)&Molecules_with_O,&local_90);
      it._M_node = (_Base_ptr)pVar10.first._M_node;
      m = (pair<const_unsigned_long,_Molecule> *)&Molecules_with_O;
    }
  }
  else {
    pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                       (constrains,0);
    if (pvVar5->subject == 0) {
      pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                         (constrains,0);
      if (pvVar5->object != 0xffffffffffffffff) {
        pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                           (constrains,0);
        m = (pair<const_unsigned_long,_Molecule> *)
            Molecules::GetMoleculesFromInvertedIdx((Molecules *)diplo::M,pvVar5->object);
      }
    }
    else {
      pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                         (constrains,0);
      local_68 = Molecules::GetPair((Molecules *)diplo::M,pvVar5->subject);
      if (local_68 != (pair<const_unsigned_long,_Molecule> *)0x0) {
        pVar10 = std::
                 set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                 ::insert((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                           *)&Molecules_with_O,&local_68);
        m_1 = (pair<const_unsigned_long,_Molecule> *)pVar10.first._M_node;
        local_80 = pVar10.second;
        m = (pair<const_unsigned_long,_Molecule> *)&Molecules_with_O;
      }
    }
  }
  if (m != (pair<const_unsigned_long,_Molecule> *)0x0) {
    local_a8._M_node =
         (_Base_ptr)
         std::
         set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
         ::begin((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                  *)m);
    while( true ) {
      local_b0._M_node =
           (_Base_ptr)
           std::
           set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
           ::end((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                  *)m);
      bVar2 = std::operator!=(&local_a8,&local_b0);
      if (!bVar2) break;
      if (((diplo::ProvTrigerON & 1) == 0) ||
         (bVar2 = std::
                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)diplo::ProvMolecules), bVar2)) {
LAB_0017f5ee:
        diplo::ProvFilterCH = 0;
        diplo::moleculesCounter = diplo::moleculesCounter + 1;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&results.
                            super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this = &prov.
                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)this);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)local_128);
        sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size(projections);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)this,sVar4 + 1);
        sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size(constrains);
        sVar7 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size(projections);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)local_128,sVar4 + sVar7);
        bVar2 = false;
        for (uStack_138 = 0;
            sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size
                              (constrains), uStack_138 < sVar4; uStack_138 = uStack_138 + 1) {
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&results.
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                             (constrains,uStack_138);
          if (pvVar5->object == 0xffffffffffffffff) {
            i_1._4_4_ = 0xffffffff;
          }
          else {
            pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                               (constrains,uStack_138);
            i_1._4_4_ = KeyManager::GetType(pvVar5->object);
          }
          pppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                    operator*(&local_a8);
          TVar3 = KeyManager::GetType((*pppVar6)->first);
          pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                             (constrains,uStack_138);
          TemplateManager::GetTemplates
                    ((TemplateManager *)diplo::TM,TVar3,pvVar5->predicate,i_1._4_4_,0,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&results.
                         super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                    operator*(&local_a8);
          ppVar1 = *pppVar6;
          pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                             (constrains,uStack_138);
          o = pvVar5->object;
          pvVar8 = std::
                   vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                 *)local_128,uStack_138);
          Molecule::CheckIfEntityExists
                    (&ppVar1->second,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&results.
                         super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,o,0,pvVar8);
          pvVar8 = std::
                   vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                 *)local_128,uStack_138);
          sVar9 = std::
                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size(pvVar8);
          if ((sVar9 == 0) &&
             (pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                                 (constrains,uStack_138), pvVar5->prov == 0)) {
            bVar2 = true;
            break;
          }
        }
        if (!bVar2) {
          for (local_148 = 0;
              sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size
                                (projections), local_148 < sVar4; local_148 = local_148 + 1) {
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&results.
                        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                      operator*(&local_a8);
            TVar3 = KeyManager::GetType((*pppVar6)->first);
            pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::operator[]
                               (projections,local_148);
            TemplateManager::GetTemplates
                      ((TemplateManager *)diplo::TM,TVar3,pvVar5->predicate,0xffffffff,0,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&results.
                           super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                      operator*(&local_a8);
            ppVar1 = *pppVar6;
            pvVar8 = std::
                     vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                   *)&prov.
                                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            sVar4 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::size
                              (constrains);
            prov_00 = std::
                      vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                    *)local_128,local_148 + sVar4);
            Molecule::GetEntity(&ppVar1->second,
                                (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&results.
                                    super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0,pvVar8,
                                prov_00);
            pvVar8 = std::
                     vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                   *)&prov.
                                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            sVar9 = std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::size(pvVar8);
            if ((sVar9 == 0) &&
               (pvVar5 = std::vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>::
                         operator[](projections,local_148), pvVar5->prov == 0)) {
              bVar2 = true;
              break;
            }
          }
          if (!bVar2) {
            std::
            vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
            ::push_back(resultsmaster,
                        (value_type *)
                        &prov.
                         super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
            ::push_back((vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
                         *)molecules._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (value_type *)local_128);
          }
        }
        if (diplo::ProvFilterCH != 0) {
          diplo::ProvFilterCounter = diplo::ProvFilterCounter + 1;
          diplo::ProvFilterCH = 0;
        }
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)local_128);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)&prov.
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&results.
                             super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                  operator*(&local_a8);
        local_b8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)diplo::ProvMolecules,&(*pppVar6)->first);
        tripleTemplates._M_h._M_single_bucket =
             (__node_base_ptr)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)diplo::ProvMolecules);
        bVar2 = std::__detail::operator==
                          (&local_b8,
                           (_Node_iterator_base<unsigned_long,_false> *)
                           &tripleTemplates._M_h._M_single_bucket);
        if (!bVar2) goto LAB_0017f5ee;
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::operator++
                (&local_a8,0);
    }
  }
  std::
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  ::~set((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
          *)&Molecules_with_O);
  return;
}

Assistant:

void API::TriplePatern(vector<TripleIDs>& constrains, vector<TripleIDs>& projections, vector<vector<unordered_set<KEY_ID>>> & resultsmaster, vector<vector<unordered_set<KEY_ID>>> & provmaster) {
    set<pair<const KEY_ID, Molecule>*> molecules;
    set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = NULL;
//	cerr << "constrains[0].subject: " << constrains[0].subject << endl;
    if (constrains.size() > 0) {
        if (constrains[0].subject != 0) {
            pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(constrains[0].subject);
            if (m) {
                molecules.insert(m);
                Molecules_with_O = &molecules;
//									cerr << "ok\t" << m->first << endl;
            }
        } else if (constrains[0].object != -1) {
            Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);
        }
    } else {
        pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(projections[0].subject);
        if (m) {
            molecules.insert(m);
            Molecules_with_O = &molecules;
//					cerr << "ok\t" << m->first << endl;
        }
    }

//
//	set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);


    if (Molecules_with_O) { // do we have any of this

        for (set<pair<const KEY_ID, Molecule>*>::iterator it = Molecules_with_O->begin(); it != Molecules_with_O->end(); it++) {

//             if (ProvTrigerON) {
//                 bool getit = false;
//                 for (auto p : ProvUris ) {
//                     auto ms = ProvIdx.find(p);
//                     if (ms == ProvIdx.end()) continue;
// 
//                     if (ms->second.find((*it)->first) != ms->second.end()) {
//                         getit = true;
//                         break;
//                     }
//                 }
//                 if (!getit) continue;
//             }
		  
            if (ProvTrigerON and !ProvMolecules.empty())
                if (ProvMolecules.find((*it)->first) == ProvMolecules.end())
                    continue;
		  
		  
		  
            //cerr << "molecules: " << diplo::KM.Get((*it)->first) << endl;
            diplo::ProvFilterCH = false;
            diplo::moleculesCounter++;
            unordered_set<size_t> tripleTemplates;
            vector<unordered_set<KEY_ID>> results;
            vector<unordered_set<KEY_ID> > prov;

            results.resize(projections.size()+1);
            prov.resize( constrains.size()+projections.size() );
            bool cont = false;
            for (size_t i = 0; i < constrains.size(); i++) {
                tripleTemplates.clear();
                TYPE_ID tt;
                if (constrains[i].object == -1) tt = -1;
                else tt = diplo::KM.GetType(constrains[i].object);

                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), constrains[i].predicate, tt, 0, &tripleTemplates);

                (*it)->second.CheckIfEntityExists(&tripleTemplates, constrains[i].object, 0, &prov[i]); // FIXME get prov
                if (prov[i].size() <= 0 and constrains[i].prov == 0) {
//					cerr << "OK2 " << tripleTemplates.size() << endl;
                    cont = true;
                    break;
                }
            }
            if (cont)
                goto end;

            for (size_t i = 0; i < projections.size(); i++) {
                tripleTemplates.clear();
                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), projections[i].predicate, -1, 0, &tripleTemplates);
                (*it)->second.GetEntity(&tripleTemplates, 0, 0, &results[i], &prov[i + constrains.size()]);  // FIXME get prov
//				cerr << "OK2 " << (*it)->first << "\t" << projections[i].predicate << "\t" << tripleTemplates.size() << endl;
                if (results[i].size() <= 0 and projections[i].prov == 0) {
                    cont = true;
                    break;
                }
            }
             if (cont)
                 goto end;



//			copy(results.begin(), results.end(), back_inserter(resultsmaster));
//			copy(prov.begin(), prov.end(), back_inserter(provmaster));
            resultsmaster.push_back(results);
            provmaster.push_back(prov);

            //	cout << "a-->\t" << (*it)->first << "\t" << diplo::KM.Get((*it)->first) << endl;

//			if ((*it)->first == 2097152001)
//				(*it)->second.Display();
end:
            if (diplo::ProvFilterCH) {
                diplo::ProvFilterCounter++;
                diplo::ProvFilterCH = false;
            }
        }
    }

}